

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O0

XSModel * __thiscall xercesc_4_0::GrammarResolver::getXSModel(GrammarResolver *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t XVar3;
  XSModel *pXVar4;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *toEnum;
  undefined1 local_78 [16];
  Grammar *grammar;
  undefined1 local_58 [8];
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  bool XSModelWasChanged;
  XSModel *xsModel;
  GrammarResolver *this_local;
  
  if (((this->fCacheGrammar & 1U) == 0) && ((this->fUseCachedGrammar & 1U) == 0)) {
    XVar3 = ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::size(this->fGrammarsToAddToXSModel);
    if (XVar3 == 0) {
      if (this->fXSModel == (XSModel *)0x0) {
        pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
        XSModel::XSModel(pXVar4,(XSModel *)0x0,this,this->fMemoryManager);
        this->fXSModel = pXVar4;
      }
    }
    else {
      pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      XSModel::XSModel(pXVar4,this->fXSModel,this,this->fMemoryManager);
      ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::removeAllElements(this->fGrammarsToAddToXSModel);
      this->fXSModel = pXVar4;
    }
    this_local = (GrammarResolver *)this->fXSModel;
  }
  else {
    iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[0xd])
                      (this->fGrammarPool,(undefined1 *)((long)&grammarEnum.fMemoryManager + 7));
    if ((grammarEnum.fMemoryManager._7_1_ & 1) == 0) {
      XVar3 = ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::size(this->fGrammarsToAddToXSModel);
      if (XVar3 == 0) {
        if (this->fXSModel == (XSModel *)0x0) {
          if (this->fGrammarPoolXSModel == (XSModel *)0x0) {
            pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
            XSModel::XSModel(pXVar4,(XSModel *)0x0,this,this->fMemoryManager);
            this->fXSModel = pXVar4;
            this_local = (GrammarResolver *)this->fXSModel;
          }
          else {
            this_local = (GrammarResolver *)this->fGrammarPoolXSModel;
          }
        }
        else {
          this_local = (GrammarResolver *)this->fXSModel;
        }
      }
      else {
        if (this->fXSModel == (XSModel *)0x0) {
          pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
          XSModel::XSModel(pXVar4,this->fGrammarPoolXSModel,this,this->fMemoryManager);
          this->fXSModel = pXVar4;
        }
        else {
          pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
          XSModel::XSModel(pXVar4,this->fXSModel,this,this->fMemoryManager);
          this->fXSModel = pXVar4;
        }
        ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::removeAllElements
                  (this->fGrammarsToAddToXSModel);
        this_local = (GrammarResolver *)this->fXSModel;
      }
    }
    else if (((this->fGrammarPoolXSModel == (XSModel *)0x0) &&
             (XVar3 = ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::size
                                (this->fGrammarsToAddToXSModel), XVar3 == 0)) &&
            (this->fXSModel == (XSModel *)0x0)) {
      this->fGrammarPoolXSModel = (XSModel *)CONCAT44(extraout_var,iVar2);
      this_local = (GrammarResolver *)this->fGrammarPoolXSModel;
    }
    else {
      this->fGrammarPoolXSModel = (XSModel *)CONCAT44(extraout_var,iVar2);
      ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::removeAllElements(this->fGrammarsToAddToXSModel);
      toEnum = this->fGrammarBucket;
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                 local_58,toEnum,false,this->fMemoryManager);
      while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
                     hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>
                                      *)local_58), bVar1) {
        local_78._8_8_ =
             RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::nextElement
                       ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *
                        )local_58);
        iVar2 = (*((XSerializable *)&((MemoryManager *)local_78._8_8_)->_vptr_MemoryManager)->
                  _vptr_XSerializable[5])();
        if (iVar2 == 1) {
          local_78._0_8_ = local_78._8_8_;
          toEnum = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)local_78;
          ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::addElement
                    (this->fGrammarsToAddToXSModel,(SchemaGrammar **)toEnum);
        }
      }
      pXVar4 = this->fXSModel;
      if (pXVar4 != (XSModel *)0x0) {
        XSModel::~XSModel(pXVar4);
        XMemory::operator_delete((XMemory *)pXVar4,toEnum);
      }
      XVar3 = ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::size(this->fGrammarsToAddToXSModel);
      if (XVar3 == 0) {
        this->fXSModel = (XSModel *)0x0;
        this_local = (GrammarResolver *)this->fGrammarPoolXSModel;
      }
      else {
        pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
        XSModel::XSModel(pXVar4,this->fGrammarPoolXSModel,this,this->fMemoryManager);
        this->fXSModel = pXVar4;
        ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::removeAllElements
                  (this->fGrammarsToAddToXSModel);
        this_local = (GrammarResolver *)this->fXSModel;
      }
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                 local_58);
    }
  }
  return (XSModel *)this_local;
}

Assistant:

XSModel *GrammarResolver::getXSModel()
{
    XSModel* xsModel;
    if (fCacheGrammar || fUseCachedGrammar)
    {
        // We know if the grammarpool changed thru caching, orphaning and erasing
        // but NOT by other mechanisms such as lockPool() or unlockPool() so it
        // is safest to always get it.  The grammarPool XSModel will only be 
        // regenerated if something changed.
        bool XSModelWasChanged;
        // The grammarpool will always return an xsmodel, even if it is just
        // the schema for schema xsmodel...
        xsModel = fGrammarPool->getXSModel(XSModelWasChanged);
        if (XSModelWasChanged)
        {
            // we know the grammarpool XSModel has changed or this is the
            // first call to getXSModel
            if (!fGrammarPoolXSModel && (fGrammarsToAddToXSModel->size() == 0) &&
                !fXSModel)
            { 
                fGrammarPoolXSModel = xsModel;
                return fGrammarPoolXSModel;
            }
            else
            {
                fGrammarPoolXSModel = xsModel;
                // We had previously augmented the grammar pool XSModel
                // with our our grammars or we would like to upate it now
                // so we have to regenerate the XSModel
                fGrammarsToAddToXSModel->removeAllElements();
                RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarBucket, false, fMemoryManager);
                while (grammarEnum.hasMoreElements()) 
                {
                    Grammar& grammar = (Grammar&) grammarEnum.nextElement();
                    if (grammar.getGrammarType() == Grammar::SchemaGrammarType)
                        fGrammarsToAddToXSModel->addElement((SchemaGrammar*)&grammar);
                }
                delete fXSModel;
                if (fGrammarsToAddToXSModel->size())
                {                    
                    fXSModel = new (fMemoryManager) XSModel(fGrammarPoolXSModel, this, fMemoryManager);
                    fGrammarsToAddToXSModel->removeAllElements();
                    return fXSModel;
                }       
                fXSModel = 0; 
                return fGrammarPoolXSModel;                                                      
            }       
        }
        else {
            // we know that the grammar pool XSModel is the same as before
            if (fGrammarsToAddToXSModel->size())
            {
                // we need to update our fXSModel with the new grammars               
                if (fXSModel)
                {
                    xsModel = new (fMemoryManager) XSModel(fXSModel, this, fMemoryManager);                   
                    fXSModel = xsModel;
                }
                else
                {
                    fXSModel = new (fMemoryManager) XSModel(fGrammarPoolXSModel, this, fMemoryManager);
                }
                fGrammarsToAddToXSModel->removeAllElements();
                return fXSModel;
            }
            // Nothing has changed!
            if (fXSModel)
            {
                return fXSModel;
            }
            else if (fGrammarPoolXSModel)
            {
                return fGrammarPoolXSModel;
            }
            fXSModel = new (fMemoryManager) XSModel(0, this, fMemoryManager);    
            return fXSModel;    
        }
    }
    // Not Caching...
    if (fGrammarsToAddToXSModel->size())
    {      
        xsModel = new (fMemoryManager) XSModel(fXSModel, this, fMemoryManager);
        fGrammarsToAddToXSModel->removeAllElements();
        fXSModel = xsModel;             
    }
    else if (!fXSModel)
    {
        // create a new model only if we didn't have one already
        fXSModel = new (fMemoryManager) XSModel(0, this, fMemoryManager);
    }
    return fXSModel; 
}